

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_state_redistribute.cpp
# Opt level: O2

void Redistribution::StateRedistribute
               (Box *bx,int ncomp,Array4<double> *U_out,Array4<double> *U_in,
               Array4<const_amrex::EBCellFlag> *flag,Array4<const_double> *vfrac,
               Array4<const_double> *fcx,Array4<const_double> *fcy,Array4<const_double> *fcz,
               Array4<const_double> *ccent,BCRec *d_bcrec_ptr,Array4<const_int> *itracker,
               Array4<const_double> *nrs,Array4<const_double> *alpha,Array4<const_double> *nbhd_vol,
               Array4<const_double> *cent_hat,Geometry *lev_geom,int max_order)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  EBCellFlag *pEVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  uint uVar37;
  ulong uVar38;
  int iVar39;
  long lVar40;
  uint uVar41;
  int iVar42;
  long lVar43;
  long lVar44;
  double *pdVar45;
  ulong uVar46;
  double *pdVar47;
  double *pdVar48;
  long lVar49;
  double *pdVar50;
  long lVar51;
  int iVar52;
  int iVar53;
  long lVar54;
  long lVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  int *piVar60;
  undefined4 *puVar61;
  Dim3 *pDVar62;
  int *piVar63;
  undefined4 *puVar64;
  EBCellFlag *pEVar65;
  EBCellFlag *pEVar66;
  int j_1;
  long lVar67;
  long lVar68;
  int i_nbor;
  long lVar69;
  long lVar70;
  double *pdVar71;
  double *pdVar72;
  int iVar73;
  ulong uVar74;
  int iVar75;
  long lVar76;
  long lVar77;
  int j;
  int iVar78;
  undefined8 uVar79;
  bool bVar80;
  byte bVar81;
  IntVect local_62c;
  Box *local_620;
  ulong local_618;
  long local_610;
  int local_604;
  int local_600;
  IntVect local_5fc;
  double *local_5f0;
  long local_5e8;
  Array4<const_double> *local_5e0;
  Array4<const_amrex::EBCellFlag> *local_5d8;
  Array4<double> *local_5d0;
  ulong local_5c8;
  long local_5c0;
  long local_5b8;
  long local_5b0;
  undefined1 local_5a8 [16];
  ulong local_598;
  ulong local_590;
  ulong local_588;
  ulong local_580;
  ulong local_578;
  ulong local_570;
  int local_568;
  int iStack_564;
  int iStack_560;
  int iStack_55c;
  int local_558;
  int iStack_554;
  int iStack_550;
  int iStack_54c;
  undefined1 local_548 [204];
  int iStack_47c;
  int iStack_478;
  int iStack_474;
  int local_470;
  int local_46c;
  undefined1 local_468 [8];
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  double *local_448;
  int iStack_440;
  int iStack_43c;
  int local_438;
  int iStack_434;
  int iStack_430;
  undefined4 uStack_42c;
  undefined8 local_428;
  int iStack_420;
  undefined4 uStack_41c;
  undefined4 uStack_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  int *local_408;
  int iStack_400;
  int iStack_3fc;
  int local_3f8;
  int iStack_3f4;
  int iStack_3f0;
  undefined4 uStack_3ec;
  undefined8 local_3e8;
  int iStack_3e0;
  undefined4 uStack_3dc;
  undefined4 local_3d8;
  undefined4 uStack_3d4;
  undefined4 local_3d0;
  undefined4 uStack_3cc;
  Dim3 local_3c8;
  ulong local_3bc;
  int local_3b4;
  int local_3b0;
  BCRec *local_3a8;
  EBCellFlag *local_3a0;
  Long LStack_398;
  Long local_390;
  Long LStack_388;
  Dim3 DStack_380;
  int local_374;
  int iStack_370;
  undefined8 uStack_36c;
  undefined8 local_360;
  Long LStack_358;
  Long local_350;
  Long LStack_348;
  Dim3 DStack_340;
  int local_334;
  int iStack_330;
  undefined8 uStack_32c;
  double *local_320;
  Long LStack_318;
  Long local_310;
  Long LStack_308;
  Dim3 DStack_300;
  int local_2f4;
  int aiStack_2f0 [4];
  double *local_2e0;
  Long LStack_2d8;
  Long local_2d0;
  Long LStack_2c8;
  Dim3 DStack_2c0;
  int local_2b4;
  int iStack_2b0;
  undefined8 uStack_2ac;
  double *local_2a0;
  Long LStack_298;
  Long local_290;
  Long LStack_288;
  double *local_280;
  int iStack_278;
  int iStack_274;
  int local_270;
  int iStack_26c;
  int iStack_268;
  undefined4 uStack_264;
  int local_260;
  int local_25c;
  int local_258;
  int local_254;
  int iStack_250;
  undefined8 uStack_24c;
  double *local_240;
  Long LStack_238;
  Long local_230;
  Long LStack_228;
  Dim3 local_220;
  int iStack_214;
  int iStack_210;
  undefined8 uStack_20c;
  undefined4 local_200 [27];
  undefined4 local_194 [27];
  undefined4 local_128 [30];
  Elixir eli_soln_hat;
  Box result;
  FArrayBox soln_hat_fab;
  
  bVar81 = 0;
  uVar1 = (lev_geom->domain).smallend.vect[0];
  local_578 = (ulong)uVar1;
  uVar56 = (lev_geom->domain).bigend.vect[0];
  local_570 = (ulong)uVar56;
  iVar73 = (bx->bigend).vect[1];
  local_610 = CONCAT44(local_610._4_4_,iVar73 + 1);
  uVar41 = uVar56 + 2;
  uVar37 = uVar1 - 2;
  if ((lev_geom->super_CoordSys).field_0x51 == '\0') {
    uVar41 = uVar56;
    uVar37 = uVar1;
  }
  uVar1 = (lev_geom->domain).smallend.vect[1];
  local_580 = (ulong)uVar1;
  bVar80 = (lev_geom->super_CoordSys).field_0x52 == '\0';
  uVar56 = uVar1 - 2;
  if (bVar80) {
    uVar56 = uVar1;
  }
  uVar1 = (lev_geom->domain).bigend.vect[1];
  local_588 = (ulong)uVar1;
  uVar57 = uVar1 + 2;
  if (bVar80) {
    uVar57 = uVar1;
  }
  bVar80 = (lev_geom->super_CoordSys).field_0x53 == '\0';
  uVar1 = (lev_geom->domain).smallend.vect[2];
  local_598 = (ulong)uVar1;
  uVar58 = uVar1 - 2;
  if (bVar80) {
    uVar58 = uVar1;
  }
  uVar1 = (lev_geom->domain).bigend.vect[2];
  local_590 = (ulong)uVar1;
  uVar59 = uVar1 + 2;
  if (bVar80) {
    uVar59 = uVar1;
  }
  uVar1 = (lev_geom->domain).btype.itype;
  local_558 = (bx->smallend).vect[0];
  iStack_554 = (bx->smallend).vect[1];
  iStack_550 = (bx->smallend).vect[2];
  iStack_54c = (bx->bigend).vect[0];
  local_618 = CONCAT44(local_618._4_4_,(bx->smallend).vect[0] + -1);
  local_600 = (bx->smallend).vect[2] + -1;
  local_568 = local_558 + -2;
  iStack_564 = iStack_554 + -2;
  iStack_560 = iStack_550 + -2;
  iStack_55c = iStack_54c + 2;
  uVar8 = *(undefined8 *)((bx->bigend).vect + 2);
  iVar2 = (bx->bigend).vect[2];
  uVar3 = (bx->btype).itype;
  result.bigend.vect[1] = (int)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
  result.bigend.vect[2] = (int)uVar8;
  result.btype.itype = (uint)((ulong)uVar8 >> 0x20);
  uVar8 = *(undefined8 *)(bx->smallend).vect;
  uVar9 = *(undefined8 *)((bx->smallend).vect + 2);
  result.smallend.vect[2] = (int)uVar9;
  result.bigend.vect[0] = (int)((ulong)uVar9 >> 0x20);
  result.smallend.vect[0] = (int)uVar8;
  result.smallend.vect[1] = (int)((ulong)uVar8 >> 0x20);
  result.smallend.vect[2] = result.smallend.vect[2] + -3;
  result.bigend.vect[0] = result.bigend.vect[0] + 3;
  result.smallend.vect[1] = result.smallend.vect[1] + -3;
  result.smallend.vect[0] = result.smallend.vect[0] + -3;
  result.bigend.vect[1] = result.bigend.vect[1] + 3;
  result.bigend.vect[2] = result.bigend.vect[2] + 3;
  local_604 = iVar2 + 2;
  local_620 = bx;
  local_5e0 = vfrac;
  local_5d8 = flag;
  local_5d0 = U_out;
  amrex::FArrayBox::FArrayBox
            ((FArrayBox *)&soln_hat_fab.super_BaseFab<double>,&result,ncomp,true,false,(Arena *)0x0)
  ;
  local_5f0 = soln_hat_fab.super_BaseFab<double>.dptr;
  local_5e8 = (long)soln_hat_fab.super_BaseFab<double>.domain.smallend.vect[2];
  lVar76 = (long)soln_hat_fab.super_BaseFab<double>.domain.bigend.vect[2] + 1;
  lVar54 = ((long)soln_hat_fab.super_BaseFab<double>.domain.bigend.vect[0] -
           (long)soln_hat_fab.super_BaseFab<double>.domain.smallend.vect[0]) + 1;
  lVar55 = (((long)soln_hat_fab.super_BaseFab<double>.domain.bigend.vect[1] + 1) -
           (long)soln_hat_fab.super_BaseFab<double>.domain.smallend.vect[1]) * lVar54;
  lVar69 = (lVar76 - local_5e8) * lVar55;
  uVar79._4_4_ = soln_hat_fab.super_BaseFab<double>.domain.smallend.vect[1];
  uVar79._0_4_ = soln_hat_fab.super_BaseFab<double>.domain.smallend.vect[0];
  uVar74 = (ulong)(soln_hat_fab.super_BaseFab<double>.domain.bigend.vect[0] + 1) |
           (long)soln_hat_fab.super_BaseFab<double>.domain.bigend.vect[1] + 1 << 0x20;
  amrex::BaseFab<double>::elixir<double,_0>(&eli_soln_hat,&soln_hat_fab.super_BaseFab<double>);
  local_548._0_4_ = ncomp;
  local_548._8_8_ = local_5f0;
  local_548._40_4_ = soln_hat_fab.super_BaseFab<double>.domain.smallend.vect[0];
  local_548._44_4_ = soln_hat_fab.super_BaseFab<double>.domain.smallend.vect[1];
  local_548._48_4_ = (undefined4)local_5e8;
  local_548._60_4_ = (undefined4)lVar76;
  local_548._64_4_ = soln_hat_fab.super_BaseFab<double>.nvar;
  local_548._72_8_ = U_in->p;
  local_548._80_8_ = U_in->jstride;
  local_548._88_8_ = U_in->kstride;
  local_548._96_8_ = U_in->nstride;
  uVar10 = (U_in->begin).x;
  uVar11 = (U_in->begin).y;
  uVar12 = (U_in->end).x;
  uVar13 = (U_in->end).y;
  uVar8 = *(undefined8 *)&(U_in->end).z;
  local_548._112_4_ = (undefined4)*(undefined8 *)&(U_in->begin).z;
  local_548._124_4_ = (undefined4)uVar8;
  local_548._128_4_ = (undefined4)((ulong)uVar8 >> 0x20);
  local_548._160_8_ = local_5e0->nstride;
  local_548._168_4_ = (local_5e0->begin).x;
  local_548._172_4_ = (local_5e0->begin).y;
  uVar14 = (local_5e0->end).x;
  uVar15 = (local_5e0->end).y;
  uVar8 = *(undefined8 *)&(local_5e0->end).z;
  local_548._136_4_ = SUB84(local_5e0->p,0);
  local_548._140_4_ = (undefined4)((ulong)local_5e0->p >> 0x20);
  local_548._144_4_ = (undefined4)local_5e0->jstride;
  local_548._148_4_ = (undefined4)((ulong)local_5e0->jstride >> 0x20);
  local_548._152_4_ = (undefined4)local_5e0->kstride;
  local_548._156_4_ = (undefined4)((ulong)local_5e0->kstride >> 0x20);
  local_548._176_4_ = (undefined4)*(undefined8 *)&(local_5e0->begin).z;
  local_548._188_4_ = (undefined4)uVar8;
  local_548._192_4_ = (undefined4)((ulong)uVar8 >> 0x20);
  local_548._200_4_ = local_568;
  iStack_47c = iStack_564;
  iStack_478 = iStack_560;
  iStack_474 = iStack_55c;
  local_46c = local_604;
  local_468._4_4_ = uVar37;
  local_468._0_4_ = uVar3;
  uStack_460 = CONCAT44(uVar58,uVar56);
  local_458 = CONCAT44(uVar57,uVar41);
  uStack_450 = CONCAT44(uVar1,uVar59);
  local_448 = alpha->p;
  local_428 = *(double **)&alpha->begin;
  uVar8 = *(undefined8 *)&(alpha->begin).z;
  uVar16 = (alpha->end).y;
  uVar9 = *(undefined8 *)&(alpha->end).z;
  uStack_414 = (undefined4)uVar9;
  uStack_410 = (undefined4)((ulong)uVar9 >> 0x20);
  iStack_420 = (int)uVar8;
  uStack_41c = (undefined4)((ulong)uVar8 >> 0x20);
  local_438 = (int)alpha->kstride;
  iStack_434 = (int)((ulong)alpha->kstride >> 0x20);
  iStack_430 = (int)alpha->nstride;
  uStack_42c = (undefined4)((ulong)alpha->nstride >> 0x20);
  iStack_440 = (int)alpha->jstride;
  iStack_43c = (int)((ulong)alpha->jstride >> 0x20);
  local_408 = itracker->p;
  local_3e8 = *(double **)&itracker->begin;
  uVar17 = (itracker->end).x;
  uVar18 = (itracker->end).y;
  uVar8 = *(undefined8 *)&(itracker->end).z;
  iStack_400 = (int)itracker->jstride;
  iStack_3fc = (int)((ulong)itracker->jstride >> 0x20);
  local_3f8 = (int)itracker->kstride;
  iStack_3f4 = (int)((ulong)itracker->kstride >> 0x20);
  iStack_3f0 = (int)itracker->nstride;
  uStack_3ec = (undefined4)((ulong)itracker->nstride >> 0x20);
  iStack_3e0 = (int)*(undefined8 *)&(itracker->begin).z;
  uStack_3d4 = (undefined4)uVar8;
  local_3d0 = (undefined4)((ulong)uVar8 >> 0x20);
  lVar44 = 0x1b;
  piVar60 = &DAT_0060b15c;
  pDVar62 = &local_3c8;
  for (lVar43 = lVar44; lVar43 != 0; lVar43 = lVar43 + -1) {
    pDVar62->x = *piVar60;
    piVar60 = piVar60 + (ulong)bVar81 * -2 + 1;
    pDVar62 = (Dim3 *)((long)pDVar62 + (ulong)bVar81 * -8 + 4);
  }
  puVar61 = &DAT_0060b1c8;
  puVar64 = (undefined4 *)((long)&local_360 + 4);
  for (lVar43 = lVar44; lVar43 != 0; lVar43 = lVar43 + -1) {
    *puVar64 = *puVar61;
    puVar61 = puVar61 + (ulong)bVar81 * -2 + 1;
    puVar64 = puVar64 + (ulong)bVar81 * -2 + 1;
  }
  piVar60 = &DAT_0060b234;
  piVar63 = aiStack_2f0;
  for (; iVar53 = result.bigend.vect[2], iVar39 = result.bigend.vect[1],
      iVar5 = result.bigend.vect[0], lVar44 != 0; lVar44 = lVar44 + -1) {
    *piVar63 = *piVar60;
    piVar60 = piVar60 + (ulong)bVar81 * -2 + 1;
    piVar63 = piVar63 + (ulong)bVar81 * -2 + 1;
  }
  local_280 = nrs->p;
  local_260 = (nrs->begin).x;
  local_25c = (nrs->begin).y;
  uVar8 = *(undefined8 *)&(nrs->begin).z;
  uVar19 = (nrs->end).y;
  uStack_24c = *(undefined8 *)&(nrs->end).z;
  local_258 = (int)uVar8;
  local_254 = (int)((ulong)uVar8 >> 0x20);
  local_270 = (int)nrs->kstride;
  iStack_26c = (int)((ulong)nrs->kstride >> 0x20);
  iStack_268 = (int)nrs->nstride;
  uStack_264 = (undefined4)((ulong)nrs->nstride >> 0x20);
  iStack_278 = (int)nrs->jstride;
  iStack_274 = (int)((ulong)nrs->jstride >> 0x20);
  local_240 = nbhd_vol->p;
  LStack_238 = nbhd_vol->jstride;
  local_230 = nbhd_vol->kstride;
  LStack_228 = nbhd_vol->nstride;
  local_220.x = (nbhd_vol->begin).x;
  local_220.y = (nbhd_vol->begin).y;
  uVar20 = (nbhd_vol->end).x;
  uVar21 = (nbhd_vol->end).y;
  uStack_20c = *(undefined8 *)&(nbhd_vol->end).z;
  local_220.z = (int)*(undefined8 *)&(nbhd_vol->begin).z;
  iVar78 = result.smallend.vect[0];
  lVar44 = (long)result.smallend.vect[1];
  local_5c8 = uVar74;
  local_5c0 = lVar69;
  local_5b8 = lVar54;
  local_5b0 = lVar76;
  local_5a8._0_8_ = uVar79;
  local_5a8._8_8_ = lVar55;
  local_548._16_8_ = lVar54;
  local_548._24_8_ = lVar55;
  local_548._32_8_ = lVar69;
  local_548._52_8_ = uVar74;
  local_548._104_4_ = uVar10;
  local_548._108_4_ = uVar11;
  local_548._116_4_ = uVar12;
  local_548._120_4_ = uVar13;
  local_548._180_4_ = uVar14;
  local_548._184_4_ = uVar15;
  local_470 = iVar73 + 2;
  uStack_418 = uVar16;
  uStack_3dc = uVar17;
  local_3d8 = uVar18;
  iStack_250 = uVar19;
  iStack_214 = uVar20;
  iStack_210 = uVar21;
  for (lVar43 = (long)result.smallend.vect[2]; iVar73 = iStack_54c, iVar42 = (int)lVar43,
      lVar54 = lVar44, iVar42 <= iVar53; lVar43 = lVar43 + 1) {
    for (; iVar73 = (int)lVar54, iVar73 <= iVar39; lVar54 = lVar54 + 1) {
      iVar6 = iVar78;
      if (iVar78 <= iVar5) {
        do {
          lVar55 = (long)iVar6;
          uVar74 = local_548._0_8_ & 0xffffffff;
          if ((int)local_548._0_4_ < 1) {
            uVar74 = 0;
          }
          pdVar45 = (double *)
                    (local_548._8_8_ +
                    ((lVar55 + (lVar43 - (int)local_548._48_4_) * local_548._24_8_ +
                               (lVar54 - (int)local_548._44_4_) * local_548._16_8_) -
                    (long)(int)local_548._40_4_) * 8);
          pdVar50 = (double *)
                    (local_548._72_8_ +
                    ((lVar55 + (lVar43 - (int)local_548._112_4_) * local_548._88_8_ +
                               (lVar54 - (int)local_548._108_4_) * local_548._80_8_) -
                    (long)(int)local_548._104_4_) * 8);
          while (bVar80 = uVar74 != 0, uVar74 = uVar74 - 1, bVar80) {
            *pdVar45 = *pdVar50;
            pdVar45 = pdVar45 + local_548._32_8_;
            pdVar50 = pdVar50 + local_548._96_8_;
          }
          lVar69 = (long)iVar73;
          lVar76 = (long)iVar42;
          if (((0.0 < *(double *)
                       ((lVar69 - (int)local_548._172_4_) *
                        CONCAT44(local_548._148_4_,local_548._144_4_) * 8 +
                        CONCAT44(local_548._140_4_,local_548._136_4_) +
                        (lVar55 - (int)local_548._168_4_) * 8 +
                       (lVar76 - (int)local_548._176_4_) *
                       CONCAT44(local_548._156_4_,local_548._152_4_) * 8)) &&
              (local_62c.vect[0] = iVar6, local_62c.vect[1] = iVar73, local_62c.vect[2] = iVar42,
              bVar80 = amrex::Box::contains((Box *)(local_548 + 200),&local_62c), bVar80)) &&
             (local_5fc.vect[0] = iVar6, local_5fc.vect[1] = iVar73, local_5fc.vect[2] = iVar42,
             bVar80 = amrex::Box::contains((Box *)(local_468 + 4),&local_5fc), bVar80)) {
            uVar74 = local_548._0_8_ & 0xffffffff;
            if ((int)local_548._0_4_ < 1) {
              uVar74 = 0;
            }
            pdVar50 = (double *)
                      (local_548._8_8_ +
                      ((lVar55 + (lVar43 - (int)local_548._48_4_) * local_548._24_8_ +
                                 (lVar54 - (int)local_548._44_4_) * local_548._16_8_) -
                      (long)(int)local_548._40_4_) * 8);
            pdVar45 = (double *)
                      (local_548._72_8_ +
                      ((lVar55 + (lVar43 - (int)local_548._112_4_) * local_548._88_8_ +
                                 (lVar54 - (int)local_548._108_4_) * local_548._80_8_) -
                      (long)(int)local_548._104_4_) * 8);
            while (bVar80 = uVar74 != 0, uVar74 = uVar74 - 1, bVar80) {
              *pdVar50 = *pdVar45 *
                         local_448[(lVar69 - local_428._4_4_) * CONCAT44(iStack_43c,iStack_440) +
                                   (lVar55 - (int)local_428) +
                                   (lVar76 - iStack_420) * CONCAT44(iStack_434,local_438)] *
                         *(double *)
                          ((lVar69 - (int)local_548._172_4_) *
                           CONCAT44(local_548._148_4_,local_548._144_4_) * 8 +
                           CONCAT44(local_548._140_4_,local_548._136_4_) +
                           (lVar55 - (int)local_548._168_4_) * 8 +
                          (lVar76 - (int)local_548._176_4_) *
                          CONCAT44(local_548._156_4_,local_548._152_4_) * 8);
              pdVar50 = pdVar50 + local_548._32_8_;
              pdVar45 = pdVar45 + local_548._96_8_;
            }
            lVar70 = 1;
            while( true ) {
              lVar49 = (lVar69 - local_3e8._4_4_) * CONCAT44(iStack_3fc,iStack_400);
              lVar40 = (lVar76 - iStack_3e0) * CONCAT44(iStack_3f4,local_3f8);
              if (local_408[lVar49 + (lVar55 - (int)local_3e8) + lVar40] < lVar70) break;
              lVar40 = (long)local_408[lVar49 + (lVar55 - (int)local_3e8) +
                                                lVar40 + CONCAT44(uStack_3ec,iStack_3f0) * lVar70];
              iVar52 = (&local_3c8.x)[lVar40] + iVar6;
              iVar75 = *(int *)((long)&local_360 + lVar40 * 4 + 4) + iVar73;
              iVar4 = aiStack_2f0[lVar40];
              local_62c.vect[0] = iVar52;
              local_62c.vect[1] = iVar75;
              local_62c.vect[2] = iVar4 + iVar42;
              bVar80 = amrex::Box::contains((Box *)(local_468 + 4),&local_62c);
              if (bVar80) {
                lVar40 = (long)iVar52;
                lVar49 = (long)iVar75;
                lVar68 = (long)(iVar4 + iVar42);
                uVar74 = local_548._0_8_ & 0xffffffff;
                if ((int)local_548._0_4_ < 1) {
                  uVar74 = 0;
                }
                pdVar45 = (double *)
                          (local_548._8_8_ +
                          (lVar55 + (((lVar43 - (int)local_548._48_4_) * local_548._24_8_ +
                                     (lVar54 - (int)local_548._44_4_) * local_548._16_8_) -
                                    (long)(int)local_548._40_4_)) * 8);
                pdVar50 = (double *)
                          (local_548._72_8_ +
                          ((lVar40 + (lVar68 - (int)local_548._112_4_) * local_548._88_8_ +
                                     (lVar49 - (int)local_548._108_4_) * local_548._80_8_) -
                          (long)(int)local_548._104_4_) * 8);
                while (bVar80 = uVar74 != 0, uVar74 = uVar74 - 1, bVar80) {
                  *pdVar45 = (*pdVar50 *
                              local_448[(lVar69 - local_428._4_4_) * CONCAT44(iStack_43c,iStack_440)
                                        + (lVar55 - (int)local_428) +
                                          (lVar76 - iStack_420) * CONCAT44(iStack_434,local_438) +
                                          CONCAT44(uStack_42c,iStack_430)] *
                             *(double *)
                              ((lVar49 - (int)local_548._172_4_) *
                               CONCAT44(local_548._148_4_,local_548._144_4_) * 8 +
                               CONCAT44(local_548._140_4_,local_548._136_4_) +
                               (lVar40 - (int)local_548._168_4_) * 8 +
                              (lVar68 - (int)local_548._176_4_) *
                              CONCAT44(local_548._156_4_,local_548._152_4_) * 8)) /
                             local_280[(lVar49 - local_25c) * CONCAT44(iStack_274,iStack_278) +
                                       (lVar40 - local_260) +
                                       (lVar68 - local_258) * CONCAT44(iStack_26c,local_270)] +
                             *pdVar45;
                  pdVar45 = pdVar45 + local_548._32_8_;
                  pdVar50 = pdVar50 + local_548._96_8_;
                }
              }
              lVar70 = lVar70 + 1;
            }
            uVar74 = local_548._0_8_ & 0xffffffff;
            if ((int)local_548._0_4_ < 1) {
              uVar74 = 0;
            }
            pdVar45 = (double *)
                      (local_548._8_8_ +
                      ((lVar55 + (lVar43 - (int)local_548._48_4_) * local_548._24_8_ +
                                 (lVar54 - (int)local_548._44_4_) * local_548._16_8_) -
                      (long)(int)local_548._40_4_) * 8);
            while (bVar80 = uVar74 != 0, uVar74 = uVar74 - 1, bVar80) {
              *pdVar45 = *pdVar45 /
                         local_240[(lVar69 - local_220.y) * LStack_238 +
                                   (lVar55 - local_220.x) + (lVar76 - local_220.z) * local_230];
              pdVar45 = pdVar45 + local_548._32_8_;
            }
          }
          bVar80 = iVar6 != iVar5;
          iVar6 = iVar6 + 1;
        } while (bVar80);
      }
    }
  }
  local_548._0_8_ = local_5e0->p;
  local_548._8_8_ = local_5e0->jstride;
  local_548._16_8_ = local_5e0->kstride;
  local_548._24_8_ = local_5e0->nstride;
  local_548._32_4_ = (local_5e0->begin).x;
  local_548._36_4_ = (local_5e0->begin).y;
  uVar8 = *(undefined8 *)&(local_5e0->begin).z;
  uVar22 = (local_5e0->end).y;
  local_548._52_8_ = *(undefined8 *)&(local_5e0->end).z;
  local_548._40_4_ = (undefined4)uVar8;
  local_548._44_4_ = (undefined4)((ulong)uVar8 >> 0x20);
  local_548._64_8_ = itracker->p;
  local_548._72_8_ = itracker->jstride;
  local_548._80_8_ = itracker->kstride;
  local_548._88_8_ = itracker->nstride;
  local_548._96_4_ = (itracker->begin).x;
  local_548._100_4_ = (itracker->begin).y;
  uVar23 = (itracker->end).x;
  uVar24 = (itracker->end).y;
  uVar8 = *(undefined8 *)&(itracker->end).z;
  local_548._104_4_ = (undefined4)*(undefined8 *)&(itracker->begin).z;
  local_548._116_4_ = (undefined4)uVar8;
  local_548._120_4_ = (undefined4)((ulong)uVar8 >> 0x20);
  uVar8 = *(undefined8 *)(local_620->smallend).vect;
  uVar9 = *(undefined8 *)(local_620->bigend).vect;
  uVar79 = *(undefined8 *)((local_620->bigend).vect + 2);
  local_548._128_4_ = (undefined4)uVar8;
  local_548._132_4_ = (undefined4)((ulong)uVar8 >> 0x20);
  local_548._136_4_ = (undefined4)*(undefined8 *)((local_620->smallend).vect + 2);
  local_548._140_4_ = (undefined4)uVar9;
  local_548._144_4_ = (undefined4)((ulong)uVar9 >> 0x20);
  local_548._148_4_ = (undefined4)uVar79;
  local_548._152_4_ = (undefined4)((ulong)uVar79 >> 0x20);
  local_548._160_8_ = local_5d0->p;
  local_548._168_8_ = local_5d0->jstride;
  uVar25 = (local_5d0->begin).x;
  uVar26 = (local_5d0->begin).y;
  uVar8 = *(undefined8 *)&(local_5d0->begin).z;
  uVar27 = (local_5d0->end).y;
  uVar9 = *(undefined8 *)&(local_5d0->end).z;
  iStack_474 = (int)uVar9;
  local_470 = (int)((ulong)uVar9 >> 0x20);
  local_548._200_4_ = (undefined4)uVar8;
  iStack_47c = (int)((ulong)uVar8 >> 0x20);
  local_548._176_4_ = (undefined4)local_5d0->kstride;
  local_548._180_4_ = (undefined4)((ulong)local_5d0->kstride >> 0x20);
  local_548._184_4_ = (undefined4)local_5d0->nstride;
  local_548._188_4_ = (undefined4)((ulong)local_5d0->nstride >> 0x20);
  local_468 = (undefined1  [8])alpha->p;
  uStack_460 = alpha->jstride;
  local_458 = alpha->kstride;
  uStack_450 = alpha->nstride;
  local_448._0_4_ = (alpha->begin).x;
  local_448._4_4_ = (alpha->begin).y;
  uVar8 = *(undefined8 *)&(alpha->begin).z;
  uVar28 = (alpha->end).y;
  uVar9 = *(undefined8 *)&(alpha->end).z;
  iStack_434 = (int)uVar9;
  iStack_430 = (int)((ulong)uVar9 >> 0x20);
  iStack_440 = (int)uVar8;
  iStack_43c = (int)((ulong)uVar8 >> 0x20);
  local_428 = nrs->p;
  local_408._0_4_ = (nrs->begin).x;
  local_408._4_4_ = (nrs->begin).y;
  uVar29 = (nrs->end).x;
  uVar30 = (nrs->end).y;
  uVar8 = *(undefined8 *)&(nrs->end).z;
  iStack_420 = (int)nrs->jstride;
  uStack_41c = (undefined4)((ulong)nrs->jstride >> 0x20);
  uStack_418 = (undefined4)nrs->kstride;
  uStack_414 = (undefined4)((ulong)nrs->kstride >> 0x20);
  uStack_410 = (undefined4)nrs->nstride;
  uStack_40c = (undefined4)((ulong)nrs->nstride >> 0x20);
  iStack_400 = (int)*(undefined8 *)&(nrs->begin).z;
  iStack_3f4 = (int)uVar8;
  iStack_3f0 = (int)((ulong)uVar8 >> 0x20);
  local_3e8 = local_5f0;
  iStack_3e0 = (int)local_5b8;
  uStack_3dc = (undefined4)((ulong)local_5b8 >> 0x20);
  local_3d8 = (undefined4)local_5a8._8_8_;
  uStack_3d4 = SUB84(local_5a8._8_8_,4);
  local_3d0 = (undefined4)local_5c0;
  uStack_3cc = (undefined4)((ulong)local_5c0 >> 0x20);
  local_3c8.x = local_5a8._0_4_;
  local_3c8.y = local_5a8._4_4_;
  local_3c8.z = (int)local_5e8;
  local_3bc = local_5c8;
  local_3b4 = (int)local_5b0;
  local_3b0 = soln_hat_fab.super_BaseFab<double>.nvar;
  local_3a8 = d_bcrec_ptr;
  local_3a0 = local_5d8->p;
  LStack_398 = local_5d8->jstride;
  local_390 = local_5d8->kstride;
  LStack_388 = local_5d8->nstride;
  DStack_380.x = (local_5d8->begin).x;
  DStack_380.y = (local_5d8->begin).y;
  uVar8 = *(undefined8 *)&(local_5d8->begin).z;
  uVar31 = (local_5d8->end).y;
  uStack_36c = *(undefined8 *)&(local_5d8->end).z;
  DStack_380.z = (int)uVar8;
  local_374 = (int)((ulong)uVar8 >> 0x20);
  local_360 = cent_hat->p;
  LStack_358 = cent_hat->jstride;
  local_350 = cent_hat->kstride;
  LStack_348 = cent_hat->nstride;
  DStack_340.x = (cent_hat->begin).x;
  DStack_340.y = (cent_hat->begin).y;
  uVar8 = *(undefined8 *)&(cent_hat->begin).z;
  uVar32 = (cent_hat->end).y;
  uStack_32c = *(undefined8 *)&(cent_hat->end).z;
  DStack_340.z = (int)uVar8;
  local_334 = (int)((ulong)uVar8 >> 0x20);
  local_320 = fcx->p;
  LStack_318 = fcx->jstride;
  local_310 = fcx->kstride;
  LStack_308 = fcx->nstride;
  DStack_300.x = (fcx->begin).x;
  DStack_300.y = (fcx->begin).y;
  uVar8 = *(undefined8 *)&(fcx->begin).z;
  uVar33 = (fcx->end).y;
  aiStack_2f0._4_8_ = *(undefined8 *)&(fcx->end).z;
  DStack_300.z = (int)uVar8;
  local_2f4 = (int)((ulong)uVar8 >> 0x20);
  local_2e0 = fcy->p;
  LStack_2d8 = fcy->jstride;
  local_2d0 = fcy->kstride;
  LStack_2c8 = fcy->nstride;
  DStack_2c0.x = (fcy->begin).x;
  DStack_2c0.y = (fcy->begin).y;
  uVar8 = *(undefined8 *)&(fcy->begin).z;
  uVar34 = (fcy->end).y;
  uStack_2ac = *(undefined8 *)&(fcy->end).z;
  DStack_2c0.z = (int)uVar8;
  local_2b4 = (int)((ulong)uVar8 >> 0x20);
  local_2a0 = fcz->p;
  LStack_298 = fcz->jstride;
  local_290 = fcz->kstride;
  LStack_288 = fcz->nstride;
  local_280._0_4_ = (fcz->begin).x;
  local_280._4_4_ = (fcz->begin).y;
  uVar8 = *(undefined8 *)&(fcz->begin).z;
  uVar35 = (fcz->end).y;
  uVar9 = *(undefined8 *)&(fcz->end).z;
  iStack_26c = (int)uVar9;
  iStack_268 = (int)((ulong)uVar9 >> 0x20);
  iStack_278 = (int)uVar8;
  iStack_274 = (int)((ulong)uVar8 >> 0x20);
  local_25c = (int)local_580;
  local_260 = (int)local_578;
  local_258 = (int)local_598;
  iVar39 = iStack_554 + -1;
  local_254 = (int)local_570;
  iStack_250 = (int)local_588;
  iVar5 = iStack_54c + 1;
  uStack_24c._4_4_ = max_order;
  uStack_24c._0_4_ = (int)local_590;
  local_240 = ccent->p;
  LStack_238 = ccent->jstride;
  local_230 = ccent->kstride;
  LStack_228 = ccent->nstride;
  local_220.x = (ccent->begin).x;
  local_220.y = (ccent->begin).y;
  uVar8 = *(undefined8 *)&(ccent->begin).z;
  uVar36 = (ccent->end).y;
  uStack_20c = *(undefined8 *)&(ccent->end).z;
  local_220.z = (int)uVar8;
  iStack_214 = (int)((ulong)uVar8 >> 0x20);
  lVar44 = 0x1b;
  puVar61 = &DAT_0060b15c;
  puVar64 = local_200;
  for (lVar43 = lVar44; lVar43 != 0; lVar43 = lVar43 + -1) {
    *puVar64 = *puVar61;
    puVar61 = puVar61 + (ulong)bVar81 * -2 + 1;
    puVar64 = puVar64 + (ulong)bVar81 * -2 + 1;
  }
  puVar61 = &DAT_0060b1c8;
  puVar64 = local_194;
  for (lVar43 = lVar44; lVar43 != 0; lVar43 = lVar43 + -1) {
    *puVar64 = *puVar61;
    puVar61 = puVar61 + (ulong)bVar81 * -2 + 1;
    puVar64 = puVar64 + (ulong)bVar81 * -2 + 1;
  }
  puVar61 = &DAT_0060b234;
  puVar64 = local_128;
  for (; lVar44 != 0; lVar44 = lVar44 + -1) {
    *puVar64 = *puVar61;
    puVar61 = puVar61 + (ulong)bVar81 * -2 + 1;
    puVar64 = puVar64 + (ulong)bVar81 * -2 + 1;
  }
  local_548._48_4_ = uVar22;
  local_548._108_4_ = uVar23;
  local_548._112_4_ = uVar24;
  local_548._156_4_ = ncomp;
  local_548._192_4_ = uVar25;
  local_548._196_4_ = uVar26;
  iStack_478 = uVar27;
  local_438 = uVar28;
  iStack_3fc = uVar29;
  local_3f8 = uVar30;
  iStack_370 = uVar31;
  iStack_330 = uVar32;
  aiStack_2f0[0] = uVar33;
  iStack_2b0 = uVar34;
  local_270 = uVar35;
  iStack_210 = uVar36;
  for (iVar53 = local_600; iVar78 = iVar39, iVar53 <= iVar2 + 1; iVar53 = iVar53 + 1) {
    for (; iVar78 <= (int)local_610; iVar78 = iVar78 + 1) {
      iVar42 = (int)local_618;
      if ((int)local_618 <= iVar5) {
        do {
          StateRedistribute::anon_class_1168_25_229d2891::operator()
                    ((anon_class_1168_25_229d2891 *)local_548,iVar42,iVar78,iVar53);
          iVar6 = iVar42 - iVar73;
          iVar42 = iVar42 + 1;
        } while (iVar6 != 1);
      }
    }
  }
  iVar73 = (local_5d8->begin).y;
  lVar44 = nrs->jstride;
  lVar43 = nrs->kstride;
  iVar2 = (nrs->begin).y;
  iVar5 = (nrs->begin).z;
  lVar55 = (long)(local_620->smallend).vect[1];
  lVar54 = (long)(local_620->smallend).vect[2];
  uVar74 = (ulong)(uint)ncomp;
  if (ncomp < 1) {
    uVar74 = 0;
  }
  iVar39 = (nrs->begin).x;
  iVar53 = (local_620->smallend).vect[0];
  lVar68 = (long)iVar53;
  iVar78 = (local_5d8->begin).z;
  pdVar45 = nrs->p;
  lVar69 = local_5d8->kstride;
  lVar76 = local_5d8->jstride;
  iVar42 = (local_5d8->begin).x;
  pEVar7 = local_5d8->p;
  lVar70 = local_5d0->kstride;
  lVar40 = local_5d0->jstride;
  pdVar50 = local_5d0->p +
            ((lVar68 + (lVar54 - (local_5d0->begin).z) * lVar70 +
                       (lVar55 - (local_5d0->begin).y) * lVar40) - (long)(local_5d0->begin).x);
  lVar49 = local_5d0->nstride;
  iVar6 = (local_620->bigend).vect[0];
  iVar4 = (local_620->bigend).vect[1];
  iVar52 = (local_620->bigend).vect[2];
  local_620 = (Box *)(lVar49 * 8);
  local_610 = lVar69 * 4;
  uVar38 = 0;
  while (uVar46 = uVar38, pdVar47 = pdVar50, lVar51 = lVar54,
        pEVar65 = pEVar7 + ((lVar68 + (lVar54 - iVar78) * lVar69 + (lVar55 - iVar73) * lVar76) -
                           (long)iVar42),
        pdVar71 = pdVar45 + ((lVar68 + (lVar54 - iVar5) * lVar43 + (lVar55 - iVar2) * lVar44) -
                            (long)iVar39), uVar46 != uVar74) {
    for (; pdVar48 = pdVar47, pEVar66 = pEVar65, lVar67 = lVar55, pdVar72 = pdVar71,
        lVar51 <= iVar52; lVar51 = lVar51 + 1) {
      for (; lVar67 <= iVar4; lVar67 = lVar67 + 1) {
        if (iVar53 <= iVar6) {
          lVar77 = 0;
          do {
            if ((~pEVar66[lVar77].flag & 3) == 0) {
              pdVar48[lVar77] = 1e+40;
            }
            else {
              pdVar48[lVar77] = (1.0 / (pdVar72[lVar77] + 1e-40)) * pdVar48[lVar77];
            }
            lVar77 = lVar77 + 1;
          } while ((iVar6 - iVar53) + 1 != (int)lVar77);
        }
        pdVar48 = pdVar48 + lVar40;
        pdVar72 = pdVar72 + lVar44;
        pEVar66 = pEVar66 + lVar76;
      }
      pdVar47 = pdVar47 + lVar70;
      pEVar65 = pEVar65 + lVar69;
      pdVar71 = pdVar71 + lVar43;
    }
    pdVar50 = pdVar50 + lVar49;
    local_618 = uVar46;
    uVar38 = uVar46 + 1;
  }
  amrex::Gpu::Elixir::~Elixir(&eli_soln_hat);
  amrex::BaseFab<double>::~BaseFab(&soln_hat_fab.super_BaseFab<double>);
  return;
}

Assistant:

void
Redistribution::StateRedistribute ( Box const& bx, int ncomp,
                                    Array4<Real> const& U_out,
                                    Array4<Real> const& U_in,
                                    Array4<EBCellFlag const> const& flag,
                                    Array4<Real const> const& vfrac,
                                    AMREX_D_DECL(Array4<Real const> const& fcx,
                                                 Array4<Real const> const& fcy,
                                                 Array4<Real const> const& fcz),
                                    Array4<Real const> const& ccent,
                                    amrex::BCRec  const* d_bcrec_ptr,
                                    Array4< int const> const& itracker,
                                    Array4<Real const> const& nrs,
                                    Array4<Real const> const& alpha,
                                    Array4<Real const> const& nbhd_vol,
                                    Array4<Real const> const& cent_hat,
                                    Geometry const& lev_geom,
                                    const int max_order)
{
    // Note that itracker has {4 in 2D, 8 in 3D} components and all are initialized to zero
    // We will add to the first component every time this cell is included in a merged neighborhood,
    //    either by merging or being merged
    //
    // In 2D, we identify the cells in the remaining three components with the following ordering
    //
    // ^  6 7 8
    // |  4   5
    // j  1 2 3
    //   i --->
    //
    // In 3D, We identify the cells in the remaining three components with the following ordering
    //
    //    at k-1   |   at k  |   at k+1
    //
    // ^  15 16 17 |  6 7 8  |  24 25 26
    // |  12 13 14 |  4   5  |  21 22 23
    // j  9  10 11 |  1 2 3  |  18 19 20
    //   i --->
    //
    // Note the first component of each of these arrays should never be used
    //
#if (AMREX_SPACEDIM == 2)
    amrex::GpuArray<int,9> imap{0,-1, 0, 1,-1, 1,-1, 0, 1};
    amrex::GpuArray<int,9> jmap{0,-1,-1,-1, 0, 0, 1, 1, 1};
    amrex::GpuArray<int,9> kmap{0, 0, 0, 0, 0, 0, 0, 0, 0};
#else
    amrex::GpuArray<int,27> imap{0,-1, 0, 1,-1, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1};
    amrex::GpuArray<int,27> jmap{0,-1,-1,-1, 0, 0, 1, 1, 1,-1,-1,-1, 0, 0, 0, 1, 1, 1,-1,-1,-1, 0, 0, 0, 1, 1, 1};
    amrex::GpuArray<int,27> kmap{0, 0, 0, 0, 0, 0, 0, 0, 0,-1,-1,-1,-1,-1,-1,-1,-1,-1, 1, 1, 1, 1, 1, 1, 1, 1, 1};
#endif

    const Box domain = lev_geom.Domain();
    const int domain_ilo = domain.smallEnd(0);
    const int domain_ihi = domain.bigEnd(0);
    const int domain_jlo = domain.smallEnd(1);
    const int domain_jhi = domain.bigEnd(1);
#if (AMREX_SPACEDIM == 3)
    const int domain_klo = domain.smallEnd(2);
    const int domain_khi = domain.bigEnd(2);
#endif

    AMREX_D_TERM(const auto& is_periodic_x = lev_geom.isPeriodic(0);,
                 const auto& is_periodic_y = lev_geom.isPeriodic(1);,
                 const auto& is_periodic_z = lev_geom.isPeriodic(2););

    // amrex::Print() << " IN STATE_REDISTRIBUTE DOING BOX " << bx << " with ncomp " << ncomp << std::endl;
    // amrex::Print() << " Box(U_in) " << Box(U_in) << std::endl;
    // amrex::Print() << " Box(U_out) " << Box(U_out) << std::endl;

    Box const& bxg1 = amrex::grow(bx,1);
    Box const& bxg2 = amrex::grow(bx,2);
    Box const& bxg3 = amrex::grow(bx,3);

    Box domain_per_grown = domain;
    if (is_periodic_x) domain_per_grown.grow(0,2);
    if (is_periodic_y) domain_per_grown.grow(1,2);
#if (AMREX_SPACEDIM == 3)
    if (is_periodic_z) domain_per_grown.grow(2,2);
#endif

    // Solution at the centroid of my nbhd
    FArrayBox    soln_hat_fab (bxg3,ncomp);
    Array4<Real> soln_hat = soln_hat_fab.array();
    Elixir   eli_soln_hat = soln_hat_fab.elixir();

    // Define Qhat (from Berger and Guliani)
    // Here we initialize soln_hat to equal U_in on all cells in bxg3 so that
    //      in the event we need to use soln_hat 3 cells out from the bx limits
    //      in a modified slope computation, we have a value of soln_hat to use.
    //      But we only modify soln_hat inside bxg2
    amrex::ParallelFor(bxg3,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        for (int n = 0; n < ncomp; n++)
            soln_hat(i,j,k,n) = U_in(i,j,k,n);

        if (vfrac(i,j,k) > 0.0 && bxg2.contains(IntVect(AMREX_D_DECL(i,j,k)))
                               && domain_per_grown.contains(IntVect(AMREX_D_DECL(i,j,k)))) {

            // Start with U_in(i,j,k) itself
            for (int n = 0; n < ncomp; n++)
                soln_hat(i,j,k,n) = U_in(i,j,k,n) * alpha(i,j,k,0) * vfrac(i,j,k);

            // This loops over the neighbors of (i,j,k), and doesn't include (i,j,k) itself
            for (int i_nbor = 1; i_nbor <= itracker(i,j,k,0); i_nbor++)
            {
                int r = i+imap[itracker(i,j,k,i_nbor)];
                int s = j+jmap[itracker(i,j,k,i_nbor)];
                int t = k+kmap[itracker(i,j,k,i_nbor)];

                if (domain_per_grown.contains(IntVect(AMREX_D_DECL(r,s,t))))
                {
                    for (int n = 0; n < ncomp; n++)
                        soln_hat(i,j,k,n) += U_in(r,s,t,n) * alpha(i,j,k,1) * vfrac(r,s,t) / nrs(r,s,t);
                }
            }
            for (int n = 0; n < ncomp; n++)
                soln_hat(i,j,k,n) /= nbhd_vol(i,j,k);
        }
    });

    amrex::ParallelFor(bxg1,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        if (vfrac(i,j,k) > 0.0)
        {
            int num_nbors = itracker(i,j,k,0);

            if (itracker(i,j,k,0) == 0)
            {
                if (bx.contains(IntVect(AMREX_D_DECL(i,j,k))))
                {
                    for (int n = 0; n < ncomp; n++)
                        amrex::Gpu::Atomic::Add(&U_out(i,j,k,n),alpha(i,j,k,0)*nrs(i,j,k)*soln_hat(i,j,k,n));
                }

            } else {

                for (int n = 0; n < ncomp; n++)
                {
                    bool extdir_ilo = (d_bcrec_ptr[n].lo(0) == amrex::BCType::ext_dir ||
                                       d_bcrec_ptr[n].lo(0) == amrex::BCType::hoextrap);
                    bool extdir_ihi = (d_bcrec_ptr[n].hi(0) == amrex::BCType::ext_dir ||
                                       d_bcrec_ptr[n].hi(0) == amrex::BCType::hoextrap);
                    bool extdir_jlo = (d_bcrec_ptr[n].lo(1) == amrex::BCType::ext_dir ||
                                       d_bcrec_ptr[n].lo(1) == amrex::BCType::hoextrap);
                    bool extdir_jhi = (d_bcrec_ptr[n].hi(1) == amrex::BCType::ext_dir ||
                                       d_bcrec_ptr[n].hi(1) == amrex::BCType::hoextrap);
#if (AMREX_SPACEDIM == 3)
                    bool extdir_klo = (d_bcrec_ptr[n].lo(2) == amrex::BCType::ext_dir ||
                                       d_bcrec_ptr[n].lo(2) == amrex::BCType::hoextrap);
                    bool extdir_khi = (d_bcrec_ptr[n].hi(2) == amrex::BCType::ext_dir ||
                                       d_bcrec_ptr[n].hi(2) == amrex::BCType::hoextrap);
#endif
                    // Initialize so that the slope stencil goes from -1:1 in each diretion
                    int nx = 1; int ny = 1; int nz = 1;

                    // Do we have enough extent in each coordinate direction to use the 3x3x3 stencil
                    //    or do we need to enlarge it?
                    AMREX_D_TERM(Real x_max = -1.e30; Real x_min = 1.e30;,
                                 Real y_max = -1.e30; Real y_min = 1.e30;,
                                 Real z_max = -1.e30; Real z_min = 1.e30;);

                    Real slope_stencil_min_width = 0.5;
#if (AMREX_SPACEDIM == 2)
                    int kk = 0;
#elif (AMREX_SPACEDIM == 3)
                    for(int kk(-1); kk<=1; kk++)
#endif
                    {
                     for(int jj(-1); jj<=1; jj++)
                      for(int ii(-1); ii<=1; ii++)
                        if (flag(i,j,k).isConnected(ii,jj,kk))
                        {
                            int r = i+ii; int s = j+jj; int t = k+kk;

                            x_max = amrex::max(x_max, cent_hat(r,s,t,0)+static_cast<Real>(ii));
                            x_min = amrex::min(x_min, cent_hat(r,s,t,0)+static_cast<Real>(ii));
                            y_max = amrex::max(y_max, cent_hat(r,s,t,1)+static_cast<Real>(jj));
                            y_min = amrex::min(y_min, cent_hat(r,s,t,1)+static_cast<Real>(jj));
#if (AMREX_SPACEDIM == 3)
                            z_max = amrex::max(z_max, cent_hat(r,s,t,2)+static_cast<Real>(kk));
                            z_min = amrex::min(z_min, cent_hat(r,s,t,2)+static_cast<Real>(kk));
#endif
                        }
                    }
                    // If we need to grow the stencil, we let it be -nx:nx in the x-direction,
                    //    for example.   Note that nx,ny,nz are either 1 or 2
                    if ( (x_max-x_min) < slope_stencil_min_width ) nx = 2;
                    if ( (y_max-y_min) < slope_stencil_min_width ) ny = 2;
#if (AMREX_SPACEDIM == 3)
                    if ( (z_max-z_min) < slope_stencil_min_width ) nz = 2;
#endif

                    amrex::GpuArray<amrex::Real,AMREX_SPACEDIM> slopes_eb;
                    if (nx*ny*nz == 1)
                        // Compute slope using 3x3x3 stencil
                        slopes_eb = amrex_calc_slopes_extdir_eb(
                                                    i,j,k,n,soln_hat,cent_hat,vfrac,
                                                    AMREX_D_DECL(fcx,fcy,fcz),flag,
                                                    AMREX_D_DECL(extdir_ilo, extdir_jlo, extdir_klo),
                                                    AMREX_D_DECL(extdir_ihi, extdir_jhi, extdir_khi),
                                                    AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                                    AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                                    max_order);
                    else
                    {
                        // Compute slope using grown stencil (no larger than 5x5x5)
                        slopes_eb = amrex_calc_slopes_extdir_eb_grown(
                                                    i,j,k,n,AMREX_D_DECL(nx,ny,nz),
                                                    soln_hat,cent_hat,vfrac,
                                                    AMREX_D_DECL(fcx,fcy,fcz),flag,
                                                    AMREX_D_DECL(extdir_ilo, extdir_jlo, extdir_klo),
                                                    AMREX_D_DECL(extdir_ihi, extdir_jhi, extdir_khi),
                                                    AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                                    AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                                    max_order);
                    }

                    // We do the limiting separately because this limiter limits the slope based on the values
                    //    extrapolated to the cell centroid (cent_hat) locations - unlike the limiter in amrex
                    //    which bases the limiting on values extrapolated to the face centroids.
                    amrex::GpuArray<amrex::Real,AMREX_SPACEDIM> lim_slope =
                        amrex_calc_centroid_limiter(i,j,k,n,soln_hat,flag,slopes_eb,cent_hat);

                    AMREX_D_TERM(lim_slope[0] *= slopes_eb[0];,
                                 lim_slope[1] *= slopes_eb[1];,
                                 lim_slope[2] *= slopes_eb[2];);

                    // Add to the cell itself
                    if (bx.contains(IntVect(AMREX_D_DECL(i,j,k))))
                    {
                        Real update = soln_hat(i,j,k,n);
                        AMREX_D_TERM(update += lim_slope[0] * (ccent(i,j,k,0)-cent_hat(i,j,k,0));,
                                     update += lim_slope[1] * (ccent(i,j,k,1)-cent_hat(i,j,k,1));,
                                     update += lim_slope[2] * (ccent(i,j,k,2)-cent_hat(i,j,k,2)););
                        amrex::Gpu::Atomic::Add(&U_out(i,j,k,n),alpha(i,j,k,0)*nrs(i,j,k)*update);
                    } // if bx contains

                    // This loops over the neighbors of (i,j,k), and doesn't include (i,j,k) itself
                    for (int i_nbor = 1; i_nbor <= num_nbors; i_nbor++)
                    {
                        int r = i+imap[itracker(i,j,k,i_nbor)];
                        int s = j+jmap[itracker(i,j,k,i_nbor)];
                        int t = k+kmap[itracker(i,j,k,i_nbor)];

                        if (bx.contains(IntVect(AMREX_D_DECL(r,s,t))))
                        {
                            Real update = soln_hat(i,j,k,n);
                            AMREX_D_TERM(update += lim_slope[0] * (ccent(r,s,t,0)-cent_hat(i,j,k,0) + static_cast<Real>(r-i));,
                                         update += lim_slope[1] * (ccent(r,s,t,1)-cent_hat(i,j,k,1) + static_cast<Real>(s-j));,
                                         update += lim_slope[2] * (ccent(r,s,t,2)-cent_hat(i,j,k,2) + static_cast<Real>(t-k)););
                            amrex::Gpu::Atomic::Add(&U_out(r,s,t,n),alpha(i,j,k,1)*update);
                        } // if bx contains
                    } // i_nbor
                } // n
            } // num_nbors
        } // vfrac
    });

    amrex::ParallelFor(bx,ncomp,
    [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        if (!flag(i,j,k).isCovered())
        {
            // This seems to help with a compiler issue ...
            Real denom = 1. / (nrs(i,j,k) + 1.e-40);
            U_out(i,j,k,n) *= denom;
        }
        else
        {
            U_out(i,j,k,n) = 1.e40;
        }
    });

#if 0
    //
    // This tests whether the redistribution procedure was conservative --
    //      only use if bx is the whole domain
    //
    {
      for (int n = 0; n < ncomp; n++)
      {
        Real sum1(0);
        Real sum2(0);
#if (AMREX_SPACEDIM == 2)
        int k = 0;
#else
        for (int k = bx.smallEnd(2); k <= domain.bigEnd(2); k++)
#endif
        for (int j = bx.smallEnd(1); j <= domain.bigEnd(1); j++)
        for (int i = bx.smallEnd(0); i <= domain.bigEnd(0); i++)
        {
            sum1 += vfrac(i,j,k)*U_in(i,j,k,n);
            sum2 += vfrac(i,j,k)*U_out(i,j,k,n);
        }
        if (std::abs(sum1-sum2) > 1.e-8 * sum1 && std::abs(sum1-sum2) > 1.e-8)
        {
           printf("SUMS DO NOT MATCH IN STATE REDIST : %f %f ",sum1,sum2);
           amrex::Abort();
        }
      }
    }
#endif
}